

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetResourceStateFlagString(RESOURCE_STATE State)

{
  char *pcVar1;
  string msg;
  string local_40;
  
  pcVar1 = "UNKNOWN";
  if (State == RESOURCE_STATE_UNKNOWN) {
    return pcVar1;
  }
  if ((State & State - RESOURCE_STATE_UNDEFINED) != RESOURCE_STATE_UNKNOWN) {
    FormatString<char[25]>(&local_40,(char (*) [25])"Single state is expected");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetResourceStateFlagString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x57b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x7ff < (int)State) {
    if ((int)State < 0x10000) {
      if ((int)State < 0x2000) {
        if (State == RESOURCE_STATE_COPY_DEST) {
          return "COPY_DEST";
        }
        if (State == RESOURCE_STATE_COPY_SOURCE) {
          return "COPY_SOURCE";
        }
      }
      else {
        if (State == RESOURCE_STATE_RESOLVE_DEST) {
          return "RESOLVE_DEST";
        }
        if (State == RESOURCE_STATE_RESOLVE_SOURCE) {
          return "RESOLVE_SOURCE";
        }
        if (State == RESOURCE_STATE_INPUT_ATTACHMENT) {
          return "INPUT_ATTACHMENT";
        }
      }
    }
    else if ((int)State < 0x80000) {
      if (State == RESOURCE_STATE_PRESENT) {
        return "PRESENT";
      }
      if (State == RESOURCE_STATE_BUILD_AS_READ) {
        return "BUILD_AS_READ";
      }
      if (State == RESOURCE_STATE_BUILD_AS_WRITE) {
        return "BUILD_AS_WRITE";
      }
    }
    else {
      if (State == RESOURCE_STATE_RAY_TRACING) {
        return "RAY_TRACING";
      }
      if (State == RESOURCE_STATE_COMMON) {
        return "COMMON";
      }
      if (State == RESOURCE_STATE_MAX_BIT) {
        return "SHADING_RATE";
      }
    }
    goto switchD_002f60b3_caseD_2;
  }
  if (0x3f < (int)State) {
    if ((int)State < 0x100) {
      if (State == RESOURCE_STATE_DEPTH_WRITE) {
        return "DEPTH_WRITE";
      }
      if (State == RESOURCE_STATE_DEPTH_READ) {
        return "DEPTH_READ";
      }
    }
    else {
      if (State == RESOURCE_STATE_SHADER_RESOURCE) {
        return "SHADER_RESOURCE";
      }
      if (State == RESOURCE_STATE_STREAM_OUT) {
        return "STREAM_OUT";
      }
      if (State == RESOURCE_STATE_INDIRECT_ARGUMENT) {
        return "INDIRECT_ARGUMENT";
      }
    }
    goto switchD_002f60b3_caseD_2;
  }
  switch(State - RESOURCE_STATE_UNDEFINED) {
  case RESOURCE_STATE_UNKNOWN:
    pcVar1 = "UNDEFINED";
    break;
  case RESOURCE_STATE_UNDEFINED:
    pcVar1 = "VERTEX_BUFFER";
    break;
  case RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
    pcVar1 = "CONSTANT_BUFFER";
    break;
  case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
    pcVar1 = "INDEX_BUFFER";
    break;
  default:
    if (State == RESOURCE_STATE_RENDER_TARGET) {
      return "RENDER_TARGET";
    }
    if (State == RESOURCE_STATE_UNORDERED_ACCESS) {
      return "UNORDERED_ACCESS";
    }
  case RESOURCE_STATE_VERTEX_BUFFER:
  case RESOURCE_STATE_CONSTANT_BUFFER:
  case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_UNDEFINED:
  case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER:
switchD_002f60b3_caseD_2:
    FormatString<char[23]>(&local_40,(char (*) [23])"Unknown resource state");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetResourceStateFlagString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x599);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar1;
}

Assistant:

const Char* GetResourceStateFlagString(RESOURCE_STATE State)
{
    VERIFY(State == RESOURCE_STATE_UNKNOWN || IsPowerOfTwo(State), "Single state is expected");
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update this function to handle the new resource state");
    switch (State)
    {
        // clang-format off
        case RESOURCE_STATE_UNKNOWN:           return "UNKNOWN";
        case RESOURCE_STATE_UNDEFINED:         return "UNDEFINED";
        case RESOURCE_STATE_VERTEX_BUFFER:     return "VERTEX_BUFFER";
        case RESOURCE_STATE_CONSTANT_BUFFER:   return "CONSTANT_BUFFER";
        case RESOURCE_STATE_INDEX_BUFFER:      return "INDEX_BUFFER";
        case RESOURCE_STATE_RENDER_TARGET:     return "RENDER_TARGET";
        case RESOURCE_STATE_UNORDERED_ACCESS:  return "UNORDERED_ACCESS";
        case RESOURCE_STATE_DEPTH_WRITE:       return "DEPTH_WRITE";
        case RESOURCE_STATE_DEPTH_READ:        return "DEPTH_READ";
        case RESOURCE_STATE_SHADER_RESOURCE:   return "SHADER_RESOURCE";
        case RESOURCE_STATE_STREAM_OUT:        return "STREAM_OUT";
        case RESOURCE_STATE_INDIRECT_ARGUMENT: return "INDIRECT_ARGUMENT";
        case RESOURCE_STATE_COPY_DEST:         return "COPY_DEST";
        case RESOURCE_STATE_COPY_SOURCE:       return "COPY_SOURCE";
        case RESOURCE_STATE_RESOLVE_DEST:      return "RESOLVE_DEST";
        case RESOURCE_STATE_RESOLVE_SOURCE:    return "RESOLVE_SOURCE";
        case RESOURCE_STATE_INPUT_ATTACHMENT:  return "INPUT_ATTACHMENT";
        case RESOURCE_STATE_PRESENT:           return "PRESENT";
        case RESOURCE_STATE_BUILD_AS_READ:     return "BUILD_AS_READ";
        case RESOURCE_STATE_BUILD_AS_WRITE:    return "BUILD_AS_WRITE";
        case RESOURCE_STATE_RAY_TRACING:       return "RAY_TRACING";
        case RESOURCE_STATE_COMMON:            return "COMMON";
        case RESOURCE_STATE_SHADING_RATE:      return "SHADING_RATE";
        // clang-format on
        default:
            UNEXPECTED("Unknown resource state");
            return "UNKNOWN";
    }
}